

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  int iVar2;
  fd_set *__arr;
  fd_set fds;
  fd_set local_88;
  
  __arr = &local_88;
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  local_88.__fds_bits[0] = 0;
  local_88.__fds_bits[1] = 0;
  local_88.__fds_bits[2] = 0;
  local_88.__fds_bits[3] = 0;
  local_88.__fds_bits[4] = 0;
  local_88.__fds_bits[5] = 0;
  local_88.__fds_bits[6] = 0;
  local_88.__fds_bits[7] = 0;
  local_88.__fds_bits[8] = 0;
  local_88.__fds_bits[9] = 0;
  local_88.__fds_bits[10] = 0;
  local_88.__fds_bits[0xb] = 0;
  iVar2 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  local_88.__fds_bits[0xc] = 0;
  local_88.__fds_bits[0xd] = 0;
  local_88.__fds_bits[0xe] = 0;
  local_88.__fds_bits[0xf] = 0;
  local_88.__fds_bits[iVar2 >> 6] =
       local_88.__fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar1 % 0x40) & 0x3f);
  select(iVar1 + 1,(fd_set *)__arr,(fd_set *)0x0,(fd_set *)0x0,(timeval *)timeout);
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // select(1) is used instead of an X function like XNextEvent, as the
    // wait inside those are guarded by the mutex protecting the display
    // struct, locking out other threads from using X (including GLX)
    select(fd + 1, &fds, NULL, NULL, timeout);
}